

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test3::writePreamble
          (GPUShaderFP64Test3 *this,ostream *stream,shaderStage shader_stage)

{
  std::operator<<(stream,"#version 400 core\n\nprecision highp float;\n\n");
  if (shader_stage - GEOMETRY_SHADER < 3) {
    std::operator<<(stream,&DAT_0168e78c +
                           *(int *)(&DAT_0168e78c + (ulong)(shader_stage - GEOMETRY_SHADER) * 4));
    return;
  }
  return;
}

Assistant:

void GPUShaderFP64Test3::writePreamble(std::ostream& stream, shaderStage shader_stage) const
{
	stream << "#version 400 core\n"
			  "\n"
			  "precision highp float;\n"
			  "\n";

	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		break;
	case GEOMETRY_SHADER:
		stream << "layout(points)                   in;\n"
				  "layout(points, max_vertices = 1) out;\n"
				  "\n";
		break;
	case TESS_CONTROL_SHADER:
		stream << "layout(vertices = 1) out;\n"
				  "\n";
		break;
	case TESS_EVAL_SHADER:
		stream << "layout(isolines, point_mode) in;\n"
				  "\n";
		break;
	case VERTEX_SHADER:
		break;
	}
}